

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t uVar1;
  ushort key;
  shared_container_t *container;
  _Bool _Var2;
  container_t *c;
  ushort *puVar3;
  uint uVar4;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t type2;
  uint8_t result_type;
  uint local_4c;
  roaring_array_t *local_48;
  container_t *local_40;
  ulong local_38;
  
  result_type = '\0';
  local_4c = (x2->high_low_container).size;
  if (local_4c == 0) {
    return;
  }
  uVar9 = (x1->high_low_container).size;
  uVar6 = (ulong)uVar9;
  if (uVar9 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar5 = *(x1->high_low_container).keys;
  puVar3 = (x2->high_low_container).keys;
  uVar8 = 0;
  uVar10 = 0;
  local_48 = &x2->high_low_container;
LAB_001055de:
  do {
    uVar9 = (uint)uVar10;
    key = *puVar3;
    uVar8 = (ulong)(int)uVar8;
    uVar4 = (int)uVar6 - 1;
    while( true ) {
      uVar7 = (uint)uVar8;
      if (uVar5 == key) break;
      if (key <= uVar5) {
        type2 = local_48->typecodes[uVar10 & 0xffff];
        c = get_copy_of_container
                      (local_48->containers[uVar10 & 0xffff],&type2,(_Bool)(local_48->flags & 1));
        if ((local_48->flags & 1) != 0) {
          local_48->containers[(int)uVar9] = c;
          local_48->typecodes[(int)uVar9] = type2;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar7,key,c,type2);
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar9 = uVar9 + 1;
        uVar10 = (ulong)uVar9;
        if (uVar9 == local_4c) {
          uVar7 = uVar7 + 1;
          uVar9 = local_4c;
          goto LAB_001057c3;
        }
        uVar8 = uVar8 + 1;
        puVar3 = (ushort *)((ulong)((uVar9 & 0xffff) * 2) + (long)local_48->keys);
        goto LAB_001055de;
      }
      if (uVar4 == uVar7) goto LAB_001057c8;
      uVar8 = uVar8 + 1;
      uVar5 = (x1->high_low_container).keys[uVar8 & 0xffff];
    }
    uVar1 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[uVar8 & 0xffff];
    type2 = local_48->typecodes[uVar10 & 0xffff];
    local_38 = uVar6;
    if (uVar1 == '\x04') {
      local_40 = container_xor(container,'\x04',local_48->containers[uVar10 & 0xffff],type2,
                               &result_type);
      shared_container_free(container);
    }
    else {
      local_40 = container_ixor(container,uVar1,local_48->containers[uVar10 & 0xffff],type2,
                                &result_type);
    }
    uVar1 = result_type;
    _Var2 = container_nonzero_cardinality(local_40,result_type);
    if (_Var2) {
      (x1->high_low_container).containers[uVar8] = local_40;
      (x1->high_low_container).typecodes[uVar8] = uVar1;
      uVar8 = (ulong)(uVar7 + 1);
      uVar6 = local_38;
    }
    else {
      container_free(local_40,uVar1);
      ra_remove_at_index(&x1->high_low_container,uVar7);
      uVar6 = (ulong)uVar4;
    }
    uVar9 = uVar9 + 1;
    uVar10 = (ulong)uVar9;
    uVar7 = (uint)uVar8;
    if ((uVar7 == (uint)uVar6) || (uVar9 == local_4c)) {
LAB_001057c3:
      if (uVar7 != (uint)uVar6) {
        return;
      }
LAB_001057c8:
      ra_append_copy_range
                (&x1->high_low_container,local_48,uVar9,local_4c,(_Bool)(local_48->flags & 1));
      return;
    }
    uVar5 = (x1->high_low_container).keys[uVar7 & 0xffff];
    puVar3 = (ushort *)((ulong)((uVar9 & 0xffff) * 2) + (long)local_48->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }

    // XOR can have new containers inserted from x2, but can also
    // lose containers when x1 and x2 are nonempty and identical.

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // so release
            } else {
                c = container_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }

            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}